

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_encrypt.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte *pbVar1;
  uint uVar2;
  FILE *pFVar3;
  size_t sVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  mbedtls_mpi E;
  mbedtls_mpi N;
  mbedtls_rsa_context rsa;
  mbedtls_ctr_drbg_context ctr_drbg;
  uchar buf [512];
  mbedtls_entropy_context entropy;
  uchar input [1024];
  mbedtls_mpi local_d10;
  mbedtls_mpi local_cf8;
  mbedtls_rsa_context local_ce0;
  mbedtls_ctr_drbg_context local_b90;
  byte local_a38 [520];
  mbedtls_entropy_context local_830;
  uchar local_428 [1024];
  
  if (argc != 2) {
    puts("usage: rsa_encrypt <string of max 100 characters>");
    exit(1);
  }
  printf("\n  . Seeding the random number generator...");
  fflush(_stdout);
  mbedtls_mpi_init(&local_cf8);
  mbedtls_mpi_init(&local_d10);
  mbedtls_rsa_init(&local_ce0,0,0);
  mbedtls_ctr_drbg_init(&local_b90);
  mbedtls_entropy_init(&local_830);
  uVar2 = mbedtls_ctr_drbg_seed
                    (&local_b90,mbedtls_entropy_func,&local_830,(uchar *)"rsa_encrypt",0xb);
  if (uVar2 == 0) {
    printf("\n  . Reading public key from rsa_pub.txt");
    fflush(_stdout);
    pFVar3 = fopen("rsa_pub.txt","rb");
    if (pFVar3 == (FILE *)0x0) {
      pcVar6 = " failed\n  ! Could not open rsa_pub.txt\n  ! Please run rsa_genkey first\n";
LAB_0010743f:
      puts(pcVar6);
    }
    else {
      uVar2 = mbedtls_mpi_read_file(&local_cf8,0x10,(FILE *)pFVar3);
      if (uVar2 == 0) {
        uVar2 = mbedtls_mpi_read_file(&local_d10,0x10,(FILE *)pFVar3);
        if (uVar2 == 0) {
          fclose(pFVar3);
          uVar2 = mbedtls_rsa_import(&local_ce0,&local_cf8,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                     (mbedtls_mpi *)0x0,&local_d10);
          if (uVar2 == 0) {
            pcVar6 = argv[1];
            sVar4 = strlen(pcVar6);
            if (100 < sVar4) {
              pcVar6 = " Input data larger than 100 characters.\n";
              goto LAB_0010743f;
            }
            memcpy(local_428,pcVar6,sVar4);
            printf("\n  . Generating the RSA encrypted value");
            fflush(_stdout);
            sVar4 = strlen(argv[1]);
            uVar2 = mbedtls_rsa_pkcs1_encrypt
                              (&local_ce0,mbedtls_ctr_drbg_random,&local_b90,0,sVar4,local_428,
                               local_a38);
            if (uVar2 == 0) {
              pFVar3 = fopen("result-enc.txt","wb+");
              if (pFVar3 != (FILE *)0x0) {
                if (local_ce0.len != 0) {
                  uVar7 = 0;
                  do {
                    pbVar1 = local_a38 + uVar7;
                    uVar7 = uVar7 + 1;
                    pcVar6 = " ";
                    if ((uVar7 & 0xf) == 0) {
                      pcVar6 = "\r\n";
                    }
                    fprintf(pFVar3,"%02X%s",(ulong)*pbVar1,pcVar6);
                  } while (uVar7 < local_ce0.len);
                }
                fclose(pFVar3);
                iVar5 = 0;
                printf("\n  . Done (created \"%s\")\n\n","result-enc.txt");
                goto LAB_00107449;
              }
              printf(" failed\n  ! Could not create %s\n\n","result-enc.txt");
              goto LAB_00107444;
            }
            pcVar6 = " failed\n  ! mbedtls_rsa_pkcs1_encrypt returned %d\n\n";
          }
          else {
            pcVar6 = " failed\n  ! mbedtls_rsa_import returned %d\n\n";
          }
          goto LAB_001073b2;
        }
      }
      printf(" failed\n  ! mbedtls_mpi_read_file returned %d\n\n",(ulong)uVar2);
      fclose(pFVar3);
    }
  }
  else {
    pcVar6 = " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n";
LAB_001073b2:
    printf(pcVar6,(ulong)uVar2);
  }
LAB_00107444:
  iVar5 = 1;
LAB_00107449:
  mbedtls_mpi_free(&local_cf8);
  mbedtls_mpi_free(&local_d10);
  mbedtls_ctr_drbg_free(&local_b90);
  mbedtls_entropy_free(&local_830);
  mbedtls_rsa_free(&local_ce0);
  return iVar5;
}

Assistant:

int main( int argc, char *argv[] )
{
    FILE *f;
    int ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    size_t i;
    mbedtls_rsa_context rsa;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    unsigned char input[1024];
    unsigned char buf[512];
    const char *pers = "rsa_encrypt";
    mbedtls_mpi N, E;

    if( argc != 2 )
    {
        mbedtls_printf( "usage: rsa_encrypt <string of max 100 characters>\n" );

#if defined(_WIN32)
        mbedtls_printf( "\n" );
#endif

        mbedtls_exit( exit_code );
    }

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    mbedtls_mpi_init( &N ); mbedtls_mpi_init( &E );
    mbedtls_rsa_init( &rsa, MBEDTLS_RSA_PKCS_V15, 0 );
    mbedtls_ctr_drbg_init( &ctr_drbg );
    mbedtls_entropy_init( &entropy );

    ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func,
                                 &entropy, (const unsigned char *) pers,
                                 strlen( pers ) );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n",
                        ret );
        goto exit;
    }

    mbedtls_printf( "\n  . Reading public key from rsa_pub.txt" );
    fflush( stdout );

    if( ( f = fopen( "rsa_pub.txt", "rb" ) ) == NULL )
    {
        mbedtls_printf( " failed\n  ! Could not open rsa_pub.txt\n" \
                "  ! Please run rsa_genkey first\n\n" );
        goto exit;
    }

    if( ( ret = mbedtls_mpi_read_file( &N, 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &E, 16, f ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_read_file returned %d\n\n",
                        ret );
        fclose( f );
        goto exit;
    }
    fclose( f );

    if( ( ret = mbedtls_rsa_import( &rsa, &N, NULL, NULL, NULL, &E ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_rsa_import returned %d\n\n",
                        ret );
        goto exit;
    }

    if( strlen( argv[1] ) > 100 )
    {
        mbedtls_printf( " Input data larger than 100 characters.\n\n" );
        goto exit;
    }

    memcpy( input, argv[1], strlen( argv[1] ) );

    /*
     * Calculate the RSA encryption of the hash.
     */
    mbedtls_printf( "\n  . Generating the RSA encrypted value" );
    fflush( stdout );

    ret = mbedtls_rsa_pkcs1_encrypt( &rsa, mbedtls_ctr_drbg_random,
                                     &ctr_drbg, MBEDTLS_RSA_PUBLIC,
                                     strlen( argv[1] ), input, buf );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_rsa_pkcs1_encrypt returned %d\n\n",
                        ret );
        goto exit;
    }

    /*
     * Write the signature into result-enc.txt
     */
    if( ( f = fopen( "result-enc.txt", "wb+" ) ) == NULL )
    {
        mbedtls_printf( " failed\n  ! Could not create %s\n\n", "result-enc.txt" );
        goto exit;
    }

    for( i = 0; i < rsa.len; i++ )
        mbedtls_fprintf( f, "%02X%s", buf[i],
                 ( i + 1 ) % 16 == 0 ? "\r\n" : " " );

    fclose( f );

    mbedtls_printf( "\n  . Done (created \"%s\")\n\n", "result-enc.txt" );

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:
    mbedtls_mpi_free( &N ); mbedtls_mpi_free( &E );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );
    mbedtls_rsa_free( &rsa );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}